

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::
MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
::ParseValue(MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
             *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values_)

{
  const_iterator cVar1;
  ostream *poVar2;
  MapError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  string local_1b0;
  ostringstream problem;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(values_,0);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&key);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->map)._M_h,&key);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::vector<MappingEnum,std::allocator<MappingEnum>>::emplace_back<MappingEnum_const&>
              ((vector<MappingEnum,std::allocator<MappingEnum>> *)&this->values,
               (MappingEnum *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
                      ._M_cur + 0x28));
    std::__cxx11::string::~string((string *)&key);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
  poVar2 = std::operator<<((ostream *)&problem,"Could not find key \'");
  poVar2 = std::operator<<(poVar2,(string *)&key);
  poVar2 = std::operator<<(poVar2,"\' in map for arg \'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name);
  std::operator<<(poVar2,"\'");
  this_00 = (MapError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  MapError::MapError(this_00,&local_1b0);
  __cxa_throw(this_00,&MapError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value = values_.at(0);

                K key;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value, key))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value, key);
#endif
                auto it = map.find(key);
                if (it == std::end(map))
                {
                    std::ostringstream problem;
                    problem << "Could not find key '" << key << "' in map for arg '" << name << "'";
#ifdef ARGS_NOEXCEPT
                    error = Error::Map;
                    errorMsg = problem.str();
#else
                    throw MapError(problem.str());
#endif
                } else
                {
                    this->values.emplace_back(it->second);
                }
            }